

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_shift_tail(roaring_array_t *ra,int32_t count,int32_t distance)

{
  int iVar1;
  int iVar2;
  int32_t dstpos;
  int32_t srcpos;
  int32_t distance_local;
  int32_t count_local;
  roaring_array_t *ra_local;
  
  if (0 < distance) {
    extend_array(ra,distance);
  }
  iVar1 = ra->size - count;
  iVar2 = iVar1 + distance;
  memmove(ra->keys + iVar2,ra->keys + iVar1,(long)count << 1);
  memmove(ra->containers + iVar2,ra->containers + iVar1,(long)count << 3);
  memmove(ra->typecodes + iVar2,ra->typecodes + iVar1,(long)count);
  ra->size = distance + ra->size;
  return;
}

Assistant:

void ra_shift_tail(roaring_array_t *ra, int32_t count, int32_t distance) {
    if (distance > 0) {
        extend_array(ra, distance);
    }
    int32_t srcpos = ra->size - count;
    int32_t dstpos = srcpos + distance;
    memmove(&(ra->keys[dstpos]), &(ra->keys[srcpos]),
            sizeof(uint16_t) * count);
    memmove(&(ra->containers[dstpos]), &(ra->containers[srcpos]),
            sizeof(container_t *) * count);
    memmove(&(ra->typecodes[dstpos]), &(ra->typecodes[srcpos]),
            sizeof(uint8_t) * count);
    ra->size += distance;
}